

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

undefined8 __thiscall pbrt::syntactic::ParamArray<int>::toString_abi_cxx11_(ParamArray<int> *this)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  size_t i;
  stringstream ss;
  size_t in_stack_fffffffffffffde8;
  ParamArray<int> *this_00;
  ulong local_1d0;
  string local_1b8 [32];
  stringstream local_198 [16];
  ParamArray<int> local_188 [4];
  
  std::__cxx11::stringstream::stringstream(local_198);
  (**(code **)*in_RSI)(local_1b8);
  poVar2 = std::operator<<((ostream *)local_188,local_1b8);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string(local_1b8);
  std::operator<<((ostream *)local_188,"[ ");
  local_1d0 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RSI + 3));
    if (sVar3 <= local_1d0) break;
    this_00 = local_188;
    iVar1 = get(this_00,in_stack_fffffffffffffde8);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,iVar1);
    std::operator<<(poVar2," ");
    local_1d0 = local_1d0 + 1;
  }
  std::operator<<((ostream *)local_188,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string ParamArray<int>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      for (size_t i=0;i<this->size();i++)
        ss << get(i) << " ";
      ss << "]";
      return ss.str();
    }